

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O0

void PlayingState::CmdWield
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  pointer *this;
  bool bVar1;
  HandType HVar2;
  element_type *peVar3;
  element_type *name;
  element_type *peVar4;
  element_type *peVar5;
  ostream *poVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *input_00;
  string local_968 [32];
  undefined1 local_948 [32];
  undefined1 local_928 [48];
  undefined1 local_8f8 [48];
  undefined1 local_8c8 [32];
  undefined1 local_8a8 [32];
  undefined1 local_888 [32];
  undefined1 local_868 [8];
  shared_ptr<Item> off_2;
  shared_ptr<Item> main_3;
  undefined1 local_828 [48];
  undefined1 local_7f8 [32];
  undefined1 local_7d8 [32];
  undefined1 local_7b8 [32];
  undefined1 local_798 [48];
  undefined1 local_768 [32];
  undefined1 local_748 [55];
  allocator local_711;
  string local_710 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  shared_ptr<Wieldable> main_hand_1;
  shared_ptr<Item> off_1;
  shared_ptr<Item> main_2;
  undefined1 local_690 [48];
  string local_660 [39];
  allocator local_639;
  string local_638 [32];
  undefined1 local_618 [16];
  undefined1 local_608 [8];
  shared_ptr<Wieldable> main_hand;
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [8];
  shared_ptr<Item> main_1;
  shared_ptr<Item> off;
  undefined1 local_578 [32];
  undefined1 local_558 [48];
  undefined1 local_528 [32];
  undefined1 local_508 [40];
  stringstream ss_1;
  ostream local_4d8 [376];
  undefined1 local_360 [8];
  shared_ptr<Item> main;
  undefined1 local_348 [4];
  HandType hand;
  shared_ptr<Wieldable> wieldable;
  undefined1 local_318 [40];
  string local_2f0 [32];
  undefined1 local_2d0 [8];
  shared_ptr<Mixin> mixin;
  string local_2b8 [32];
  stringstream local_298 [8];
  stringstream ss;
  ostream local_288 [376];
  string local_110 [32];
  undefined1 local_f0 [8];
  shared_ptr<Item> item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  Utils local_a8 [8];
  string match;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_78;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  shared_ptr<Player> player;
  shared_ptr<GameData> *game_data_local;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  
  std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)connection
            );
  this = &items.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Connection::GetPlayer((Connection *)this);
  peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
  ;
  ItemContainer::GetItems_abi_cxx11_(&local_78,&peVar3->super_ItemContainer);
  Utils::ExtractMapKeys<std::__cxx11::string,int>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48,(Utils *)&local_78,input_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  std::__cxx11::string::string
            ((string *)&item.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)input);
  Utils::FindMatch(local_a8,&local_c0,
                   (string *)&item.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string
            ((string *)&item.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  name = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    game_data);
  std::__cxx11::string::string(local_110,(string *)local_a8);
  GameData::GetItem((GameData *)local_f0,(string *)name);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::stringstream::stringstream(local_298);
  bVar1 = std::operator==((shared_ptr<Item> *)local_f0,(nullptr_t)0x0);
  if (bVar1) {
    poVar6 = std::operator<<(local_288,"You do not carry that item!");
    std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
    peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &items.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::stringstream::str();
    (**(peVar3->super_Entity)._vptr_Entity)(peVar3,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    mixin.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
    goto LAB_001f31ae;
  }
  peVar4 = std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"Wieldable",(allocator *)(local_318 + 0x27));
  MixinContainer::GetMixin((MixinContainer *)local_2d0,(string *)peVar4);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_318 + 0x27));
  bVar1 = std::operator==((shared_ptr<Mixin> *)local_2d0,(nullptr_t)0x0);
  if (bVar1) {
    std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_f0);
    Item::GetItemName_abi_cxx11_((Item *)local_318);
    poVar6 = std::operator<<(local_288,(string *)local_318);
    poVar6 = std::operator<<(poVar6," can not be wielded!");
    std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_318);
    peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &items.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::stringstream::str();
    (**(peVar3->super_Entity)._vptr_Entity)
              (peVar3,&wieldable.super___shared_ptr<Wieldable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &wieldable.super___shared_ptr<Wieldable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    mixin.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  }
  else {
    std::dynamic_pointer_cast<Wieldable,Mixin>((shared_ptr<Mixin> *)local_348);
    peVar5 = std::__shared_ptr_access<Wieldable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Wieldable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_348);
    main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         Wieldable::GetHandType(peVar5);
    if (main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ ==
        MAIN_HAND) {
      std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &items.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Player::GetMainHand((Player *)local_360);
      std::__cxx11::stringstream::stringstream((stringstream *)(local_508 + 0x20));
      bVar1 = std::operator!=((shared_ptr<Item> *)local_360,(nullptr_t)0x0);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&items.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_360)
        ;
        Item::GetItemName_abi_cxx11_((Item *)local_508);
        ItemContainer::AddItem(&peVar3->super_ItemContainer,(string *)local_508);
        std::__cxx11::string::~string((string *)local_508);
        poVar6 = std::operator<<(local_4d8,"Removed ");
        std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_360)
        ;
        Item::GetItemName_abi_cxx11_((Item *)local_528);
        poVar6 = std::operator<<(poVar6,(string *)local_528);
        std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_528);
      }
      peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &items.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<Item>::shared_ptr
                ((shared_ptr<Item> *)(local_558 + 0x20),(shared_ptr<Item> *)local_f0);
      Player::SetMainHand(peVar3,(shared_ptr<Item> *)(local_558 + 0x20));
      std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)(local_558 + 0x20));
      peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &items.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_f0);
      Item::GetItemName_abi_cxx11_((Item *)local_558);
      ItemContainer::RemoveItem(&peVar3->super_ItemContainer,(string *)local_558);
      std::__cxx11::string::~string((string *)local_558);
      poVar6 = std::operator<<(local_4d8,"Wielding ");
      std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_f0);
      Item::GetItemName_abi_cxx11_((Item *)local_578);
      poVar6 = std::operator<<(poVar6,(string *)local_578);
      std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_578);
      peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &items.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::stringstream::str();
      (**(peVar3->super_Entity)._vptr_Entity)
                (peVar3,&off.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string
                ((string *)&off.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_508 + 0x20));
      std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)local_360);
LAB_001f3143:
      peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &items.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::stringstream::str();
      (**(peVar3->super_Entity)._vptr_Entity)(peVar3,local_968);
      std::__cxx11::string::~string(local_968);
      mixin.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
    }
    else {
      if (main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ !=
          OFF_HAND) {
        if (main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ !=
            EITHER_HAND) {
          if (main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ ==
              TWO_HAND) {
            std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &items.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Player::GetMainHand((Player *)
                                &off_2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
            std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &items.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Player::GetOffHand((Player *)local_868);
            bVar1 = std::operator!=((shared_ptr<Item> *)
                                    &off_2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount,(nullptr_t)0x0);
            if (bVar1) {
              peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&items.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &off_2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              Item::GetItemName_abi_cxx11_((Item *)local_888);
              ItemContainer::AddItem(&peVar3->super_ItemContainer,(string *)local_888);
              std::__cxx11::string::~string((string *)local_888);
              poVar6 = std::operator<<(local_288,"Unwielded ");
              std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &off_2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              Item::GetItemName_abi_cxx11_((Item *)local_8a8);
              poVar6 = std::operator<<(poVar6,(string *)local_8a8);
              std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
              std::__cxx11::string::~string((string *)local_8a8);
            }
            bVar1 = std::operator!=((shared_ptr<Item> *)local_868,(nullptr_t)0x0);
            if (bVar1) {
              peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&items.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_868);
              Item::GetItemName_abi_cxx11_((Item *)local_8c8);
              ItemContainer::AddItem(&peVar3->super_ItemContainer,(string *)local_8c8);
              std::__cxx11::string::~string((string *)local_8c8);
              peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&items.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::shared_ptr<Item>::shared_ptr
                        ((shared_ptr<Item> *)(local_8f8 + 0x20),(nullptr_t)0x0);
              Player::SetOffHand(peVar3,(shared_ptr<Item> *)(local_8f8 + 0x20));
              std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)(local_8f8 + 0x20));
              poVar6 = std::operator<<(local_288,"Unwielded ");
              std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_868);
              Item::GetItemName_abi_cxx11_((Item *)local_8f8);
              poVar6 = std::operator<<(poVar6,(string *)local_8f8);
              std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
              std::__cxx11::string::~string((string *)local_8f8);
            }
            peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&items.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::shared_ptr<Item>::shared_ptr
                      ((shared_ptr<Item> *)(local_928 + 0x20),(shared_ptr<Item> *)local_f0);
            Player::SetMainHand(peVar3,(shared_ptr<Item> *)(local_928 + 0x20));
            std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)(local_928 + 0x20));
            peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&items.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_f0);
            Item::GetItemName_abi_cxx11_((Item *)local_928);
            ItemContainer::RemoveItem(&peVar3->super_ItemContainer,(string *)local_928);
            std::__cxx11::string::~string((string *)local_928);
            poVar6 = std::operator<<(local_288,"Wielding ");
            std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_f0);
            Item::GetItemName_abi_cxx11_((Item *)local_948);
            poVar6 = std::operator<<(poVar6,(string *)local_948);
            poVar6 = std::operator<<(poVar6," in main hand");
            std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_948);
            std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)local_868);
            std::shared_ptr<Item>::~shared_ptr
                      ((shared_ptr<Item> *)
                       &off_2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          goto LAB_001f3143;
        }
        std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &items.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Player::GetMainHand((Player *)
                            &off_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &items.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Player::GetOffHand((Player *)
                           &main_hand_1.super___shared_ptr<Wieldable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        bVar1 = std::operator!=((shared_ptr<Item> *)
                                &off_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,(nullptr_t)0x0);
        if (bVar1) {
          peVar4 = std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                              )&off_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_710,"Wieldable",&local_711);
          MixinContainer::GetMixin((MixinContainer *)local_6f0,(string *)peVar4);
          std::dynamic_pointer_cast<Wieldable,Mixin>((shared_ptr<Mixin> *)local_6e0);
          std::shared_ptr<Mixin>::~shared_ptr((shared_ptr<Mixin> *)local_6f0);
          std::__cxx11::string::~string(local_710);
          std::allocator<char>::~allocator((allocator<char> *)&local_711);
          bVar1 = std::operator==((shared_ptr<Item> *)
                                  &main_hand_1.
                                   super___shared_ptr<Wieldable,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount,(nullptr_t)0x0);
          if (bVar1) {
            peVar5 = std::__shared_ptr_access<Wieldable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Wieldable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_6e0);
            HVar2 = Wieldable::GetHandType(peVar5);
            if (HVar2 == TWO_HAND) goto LAB_001f2816;
            peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&items.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::shared_ptr<Item>::shared_ptr
                      ((shared_ptr<Item> *)(local_748 + 0x20),(shared_ptr<Item> *)local_f0);
            Player::SetOffHand(peVar3,(shared_ptr<Item> *)(local_748 + 0x20));
            std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)(local_748 + 0x20));
            peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&items.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_f0);
            Item::GetItemName_abi_cxx11_((Item *)local_748);
            ItemContainer::RemoveItem(&peVar3->super_ItemContainer,(string *)local_748);
            std::__cxx11::string::~string((string *)local_748);
            poVar6 = std::operator<<(local_288,"Wielding ");
            std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_f0);
            Item::GetItemName_abi_cxx11_((Item *)local_768);
            poVar6 = std::operator<<(poVar6,(string *)local_768);
            poVar6 = std::operator<<(poVar6," in off hand");
            std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_768);
          }
          else {
LAB_001f2816:
            peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&items.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::shared_ptr<Item>::shared_ptr
                      ((shared_ptr<Item> *)(local_798 + 0x20),(shared_ptr<Item> *)local_f0);
            Player::SetMainHand(peVar3,(shared_ptr<Item> *)(local_798 + 0x20));
            std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)(local_798 + 0x20));
            peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&items.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_f0);
            Item::GetItemName_abi_cxx11_((Item *)local_798);
            ItemContainer::RemoveItem(&peVar3->super_ItemContainer,(string *)local_798);
            std::__cxx11::string::~string((string *)local_798);
            peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&items.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &off_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            Item::GetItemName_abi_cxx11_((Item *)local_7b8);
            ItemContainer::AddItem(&peVar3->super_ItemContainer,(string *)local_7b8);
            std::__cxx11::string::~string((string *)local_7b8);
            poVar6 = std::operator<<(local_288,"Unwielded ");
            std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &off_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            Item::GetItemName_abi_cxx11_((Item *)local_7d8);
            poVar6 = std::operator<<(poVar6,(string *)local_7d8);
            std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_7d8);
            poVar6 = std::operator<<(local_288,"Wielding ");
            std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_f0);
            Item::GetItemName_abi_cxx11_((Item *)local_7f8);
            poVar6 = std::operator<<(poVar6,(string *)local_7f8);
            poVar6 = std::operator<<(poVar6," in main hand");
            std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_7f8);
          }
          std::shared_ptr<Wieldable>::~shared_ptr((shared_ptr<Wieldable> *)local_6e0);
        }
        else {
          peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&items.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::shared_ptr<Item>::shared_ptr
                    ((shared_ptr<Item> *)(local_828 + 0x20),(shared_ptr<Item> *)local_f0);
          Player::SetMainHand(peVar3,(shared_ptr<Item> *)(local_828 + 0x20));
          std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)(local_828 + 0x20));
          peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&items.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_f0
                    );
          Item::GetItemName_abi_cxx11_((Item *)local_828);
          ItemContainer::RemoveItem(&peVar3->super_ItemContainer,(string *)local_828);
          std::__cxx11::string::~string((string *)local_828);
          poVar6 = std::operator<<(local_288,"Wielding ");
          std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_f0
                    );
          Item::GetItemName_abi_cxx11_
                    ((Item *)&main_3.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          poVar6 = std::operator<<(poVar6,(string *)
                                          &main_3.
                                           super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount);
          poVar6 = std::operator<<(poVar6," in main hand");
          std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
          std::__cxx11::string::~string
                    ((string *)
                     &main_3.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::shared_ptr<Item>::~shared_ptr
                  ((shared_ptr<Item> *)
                   &main_hand_1.super___shared_ptr<Wieldable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<Item>::~shared_ptr
                  ((shared_ptr<Item> *)
                   &off_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        goto LAB_001f3143;
      }
      std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &items.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Player::GetOffHand((Player *)
                         &main_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &items.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Player::GetMainHand((Player *)local_5b8);
      bVar1 = std::operator!=((shared_ptr<Item> *)
                              &main_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,(nullptr_t)0x0);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&items.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &main_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        Item::GetItemName_abi_cxx11_((Item *)local_5d8);
        ItemContainer::AddItem(&peVar3->super_ItemContainer,(string *)local_5d8);
        std::__cxx11::string::~string((string *)local_5d8);
        poVar6 = std::operator<<(local_288,"Removed ");
        std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &main_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        Item::GetItemName_abi_cxx11_
                  ((Item *)&main_hand.super___shared_ptr<Wieldable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &main_hand.
                                         super___shared_ptr<Wieldable,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_refcount);
        std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
        std::__cxx11::string::~string
                  ((string *)
                   &main_hand.super___shared_ptr<Wieldable,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
LAB_001f2348:
        peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&items.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::shared_ptr<Item>::shared_ptr
                  ((shared_ptr<Item> *)(local_690 + 0x20),(shared_ptr<Item> *)local_f0);
        Player::SetOffHand(peVar3,(shared_ptr<Item> *)(local_690 + 0x20));
        std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)(local_690 + 0x20));
        peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&items.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_f0);
        Item::GetItemName_abi_cxx11_((Item *)local_690);
        ItemContainer::RemoveItem(&peVar3->super_ItemContainer,(string *)local_690);
        std::__cxx11::string::~string((string *)local_690);
        poVar6 = std::operator<<(local_288,"Wielding ");
        std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_f0);
        Item::GetItemName_abi_cxx11_
                  ((Item *)&main_2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        poVar6 = std::operator<<(poVar6,(string *)
                                        &main_2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
        std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
        std::__cxx11::string::~string
                  ((string *)
                   &main_2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        mixin.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
      }
      else {
        bVar1 = std::operator!=((shared_ptr<Item> *)local_5b8,(nullptr_t)0x0);
        if (!bVar1) goto LAB_001f2348;
        peVar4 = std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_5b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_638,"Wieldable",&local_639);
        MixinContainer::GetMixin((MixinContainer *)local_618,(string *)peVar4);
        std::dynamic_pointer_cast<Wieldable,Mixin>((shared_ptr<Mixin> *)local_608);
        std::shared_ptr<Mixin>::~shared_ptr((shared_ptr<Mixin> *)local_618);
        std::__cxx11::string::~string(local_638);
        std::allocator<char>::~allocator((allocator<char> *)&local_639);
        peVar5 = std::__shared_ptr_access<Wieldable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Wieldable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_608);
        HVar2 = Wieldable::GetHandType(peVar5);
        if (HVar2 == TWO_HAND) {
          poVar6 = std::operator<<(local_288,"Remove two handed weapon before equipping!");
          std::operator<<(poVar6,(string *)Format::NL_abi_cxx11_);
          peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&items.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::stringstream::str();
          (**(peVar3->super_Entity)._vptr_Entity)(peVar3,local_660);
          std::__cxx11::string::~string(local_660);
        }
        mixin.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_ = 0;
        mixin.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
             HVar2 == TWO_HAND;
        std::shared_ptr<Wieldable>::~shared_ptr((shared_ptr<Wieldable> *)local_608);
        if (mixin.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ == 0
           ) goto LAB_001f2348;
      }
      std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)local_5b8);
      std::shared_ptr<Item>::~shared_ptr
                ((shared_ptr<Item> *)
                 &main_1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (mixin.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ == 0)
      goto LAB_001f3143;
    }
    std::shared_ptr<Wieldable>::~shared_ptr((shared_ptr<Wieldable> *)local_348);
  }
  std::shared_ptr<Mixin>::~shared_ptr((shared_ptr<Mixin> *)local_2d0);
LAB_001f31ae:
  std::__cxx11::stringstream::~stringstream(local_298);
  std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)local_f0);
  std::__cxx11::string::~string((string *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  std::shared_ptr<Player>::~shared_ptr
            ((shared_ptr<Player> *)
             &items.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void PlayingState::CmdWield(const std::string &input, std::shared_ptr<Connection> connection,
                            std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto items = Utils::ExtractMapKeys(player->GetItems());
    std::string match = Utils::FindMatch(items, input);
    auto item = game_data->GetItem(match);
    std::stringstream ss;
    if(item == nullptr) {
        ss << "You do not carry that item!" << Format::NL;
        player->Send(ss.str());
        return;
    }
    auto mixin = item->GetMixin("Wieldable");
    if(mixin == nullptr) {
        ss << item->GetItemName() << " can not be wielded!" << Format::NL;
        player->Send(ss.str());
        return;
    }
    auto wieldable = std::dynamic_pointer_cast<Wieldable>(mixin);
    auto hand = wieldable->GetHandType();
    if(hand == MAIN_HAND) {
        auto main = player->GetMainHand();
        std::stringstream ss;
        if (main != nullptr) {
            player->AddItem(main->GetItemName());
            ss << "Removed " << main->GetItemName() << Format::NL;
        }
        player->SetMainHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << Format::NL;
        player->Send(ss.str());
    }
    else if(hand == OFF_HAND) {
        auto off = player->GetOffHand();
        auto main = player->GetMainHand();
        if(off != nullptr) {
            player->AddItem(off->GetItemName());
            ss << "Removed " << off->GetItemName() << Format::NL;
        }
        else if(main != nullptr) {
            auto main_hand = std::dynamic_pointer_cast<Wieldable>(main->GetMixin("Wieldable"));
            if (main_hand->GetHandType() == TWO_HAND) {
                ss << "Remove two handed weapon before equipping!" << Format::NL;
                player->Send(ss.str());
                return;
            }
        }
        player->SetOffHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << Format::NL;
    }
    else if(hand == EITHER_HAND) {
        auto main = player->GetMainHand();
        auto off = player->GetOffHand();
        if(main != nullptr) {
            auto main_hand = std::dynamic_pointer_cast<Wieldable>(main->GetMixin("Wieldable"));
            if(off == nullptr and main_hand->GetHandType() != TWO_HAND) {
                player->SetOffHand(item);
                player->RemoveItem(item->GetItemName());
                ss << "Wielding " << item->GetItemName() << " in off hand" << Format::NL;
            }
            else {
                player->SetMainHand(item);
                player->RemoveItem(item->GetItemName());
                player->AddItem(main->GetItemName());
                ss << "Unwielded " << main->GetItemName() << Format::NL;
                ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
            }
        }
        else {
            player->SetMainHand(item);
            player->RemoveItem(item->GetItemName());
            ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
        }
    }
    else if(hand == TWO_HAND) {
        auto main = player->GetMainHand();
        auto off = player->GetOffHand();
        if(main != nullptr) {
            player->AddItem(main->GetItemName());
            ss << "Unwielded " << main->GetItemName() << Format::NL;
        }
        if(off != nullptr) {
            player->AddItem(off->GetItemName());
            player->SetOffHand(nullptr);
            ss << "Unwielded " << off->GetItemName() << Format::NL;
        }
        player->SetMainHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
    }
    player->Send(ss.str());
}